

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::load(Compiler *this,SchemaLoader *loader,uint64_t id)

{
  Locked<kj::Own<capnp::compiler::Compiler::Impl>_> local_30;
  
  kj::_::Mutex::lock(&(this->impl).mutex,EXCLUSIVE);
  local_30.ptr = &(this->impl).value;
  local_30.mutex = &(this->impl).mutex;
  Impl::loadFinal((this->impl).value.ptr,loader,id);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl>_>::~Locked(&local_30);
  return;
}

Assistant:

void Compiler::load(const SchemaLoader& loader, uint64_t id) const {
  impl.lockExclusive()->get()->loadFinal(loader, id);
}